

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestEnumMapPlusExtraLite::~TestEnumMapPlusExtraLite(TestEnumMapPlusExtraLite *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (this_00);
    uVar1 = this_00->ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::internal::MapFieldLite<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>::
    ~MapFieldLite(&(this->field_0)._impl_.unknown_map_field_);
    google::protobuf::internal::MapFieldLite<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>::
    ~MapFieldLite(&(this->field_0)._impl_.known_map_field_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/map_lite_unittest.pb.cc"
             ,0xc5c,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestEnumMapPlusExtraLite::~TestEnumMapPlusExtraLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestEnumMapPlusExtraLite)
  SharedDtor(*this);
}